

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferInputSource.cc
# Opt level: O0

qpdf_offset_t __thiscall BufferInputSource::findAndSkipNextEOL(BufferInputSource *this)

{
  logic_error *this_00;
  uchar *puVar1;
  bool bVar2;
  uchar *local_50;
  uchar *p;
  uchar *end;
  uchar *buffer;
  qpdf_offset_t result;
  qpdf_offset_t end_pos;
  BufferInputSource *this_local;
  
  if (-1 < this->cur_offset) {
    this_local = (BufferInputSource *)this->max_offset;
    if (this->cur_offset < (long)this_local) {
      puVar1 = Buffer::getBuffer(this->buf);
      local_50 = puVar1 + this->cur_offset;
      while( true ) {
        bVar2 = false;
        if (local_50 < puVar1 + (long)this_local) {
          bVar2 = true;
          if (*local_50 != '\r') {
            bVar2 = *local_50 == '\n';
          }
          bVar2 = (bool)(bVar2 ^ 1);
        }
        if (!bVar2) break;
        local_50 = local_50 + 1;
      }
      if (local_50 < puVar1 + (long)this_local) {
        buffer = local_50 + -(long)puVar1;
        this->cur_offset = (qpdf_offset_t)(buffer + 1);
        while( true ) {
          local_50 = local_50 + 1;
          bVar2 = false;
          if ((this->cur_offset < (long)this_local) && (bVar2 = true, *local_50 != '\r')) {
            bVar2 = *local_50 == '\n';
          }
          if (!bVar2) break;
          this->cur_offset = this->cur_offset + 1;
        }
      }
      else {
        this->cur_offset = (qpdf_offset_t)this_local;
        buffer = (uchar *)this_local;
      }
      this_local = (BufferInputSource *)buffer;
    }
    else {
      (this->super_InputSource).last_offset = (qpdf_offset_t)this_local;
      this->cur_offset = (qpdf_offset_t)this_local;
    }
    return (qpdf_offset_t)this_local;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"INTERNAL ERROR: BufferInputSource offset < 0");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

qpdf_offset_t
BufferInputSource::findAndSkipNextEOL()
{
    if (this->cur_offset < 0) {
        throw std::logic_error("INTERNAL ERROR: BufferInputSource offset < 0");
    }
    qpdf_offset_t end_pos = this->max_offset;
    if (this->cur_offset >= end_pos) {
        this->last_offset = end_pos;
        this->cur_offset = end_pos;
        return end_pos;
    }

    qpdf_offset_t result = 0;
    unsigned char const* buffer = this->buf->getBuffer();
    unsigned char const* end = buffer + end_pos;
    unsigned char const* p = buffer + this->cur_offset;

    while ((p < end) && !((*p == '\r') || (*p == '\n'))) {
        ++p;
    }
    if (p < end) {
        result = p - buffer;
        this->cur_offset = result + 1;
        ++p;
        while ((this->cur_offset < end_pos) && ((*p == '\r') || (*p == '\n'))) {
            ++p;
            ++this->cur_offset;
        }
    } else {
        this->cur_offset = end_pos;
        result = end_pos;
    }
    return result;
}